

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpplocate.cpp
# Opt level: O0

_anonymous_namespace_ * __thiscall
(anonymous_namespace)::obtainStringFromLibLocate_abi_cxx11_
          (_anonymous_namespace_ *this,char *path,uint length)

{
  allocator local_1e;
  undefined1 local_1d;
  uint local_1c;
  char *pcStack_18;
  uint length_local;
  char *path_local;
  string *result;
  
  local_1c = length;
  pcStack_18 = path;
  path_local = (char *)this;
  if ((path == (char *)0x0) || (length == 0)) {
    std::__cxx11::string::string((string *)this);
  }
  else {
    local_1d = 0;
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,path,(ulong)length,&local_1e);
    std::allocator<char>::~allocator((allocator<char> *)&local_1e);
    free(pcStack_18);
  }
  return this;
}

Assistant:

std::string obtainStringFromLibLocate(char * path, unsigned int length)
{
    if (path == nullptr || length == 0)
    {
        return std::string();
    }

    auto result = std::string(path, length);

    // liblocate transfer ownership of pointer behind path variable
    free(path);

    return result;
}